

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

size_t __thiscall
Assimp::IFC::anon_unknown_9::PolyLine::EstimateSampleCount(PolyLine *this,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  bool local_21;
  IfcFloat b_local;
  IfcFloat a_local;
  PolyLine *this_local;
  
  bVar1 = Curve::InRange((Curve *)this,a);
  local_21 = false;
  if (bVar1) {
    local_21 = Curve::InRange((Curve *)this,b);
  }
  if (local_21 != false) {
    dVar3 = ceil(b);
    dVar4 = floor(a);
    uVar2 = (ulong)(dVar3 - dVar4);
    return uVar2 | (long)((dVar3 - dVar4) - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  }
  __assert_fail("InRange(a) && InRange(b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x1c1,
                "virtual size_t Assimp::IFC::(anonymous namespace)::PolyLine::EstimateSampleCount(IfcFloat, IfcFloat) const"
               );
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert(InRange(a) && InRange(b));
        return static_cast<size_t>( std::ceil(b) - std::floor(a) );
    }